

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::check_physical_type_cast
          (CompilerMSL *this,string *expr,SPIRType *type,uint32_t physical_type)

{
  SPIRType *pSVar1;
  char (*in_stack_ffffffffffffff98) [2];
  string local_60 [32];
  string local_40;
  
  pSVar1 = Compiler::maybe_get<spirv_cross::SPIRType>((Compiler *)this,physical_type);
  if (((pSVar1 != (SPIRType *)0x0) && (pSVar1->storage == StorageClassPhysicalStorageBuffer)) &&
     (*(int *)&(pSVar1->super_IVariant).field_0xc == 10)) {
    if (1 < pSVar1->vecsize) {
      ::std::__cxx11::string::append((char *)expr);
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_60,this,type,0);
    join<char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_40,(spirv_cross *)0x389683,(char (*) [3])local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37f234,
               (char (*) [2])expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37f234,
               in_stack_ffffffffffffff98);
    ::std::__cxx11::string::operator=((string *)expr,(string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::__cxx11::string::~string(local_60);
  }
  return;
}

Assistant:

void CompilerMSL::check_physical_type_cast(std::string &expr, const SPIRType *type, uint32_t physical_type)
{
	auto *p_physical_type = maybe_get<SPIRType>(physical_type);
	if (p_physical_type &&
		p_physical_type->storage == StorageClassPhysicalStorageBuffer &&
		p_physical_type->basetype == to_unsigned_basetype(64))
	{
		if (p_physical_type->vecsize > 1)
			expr += ".x";

		expr = join("((", type_to_glsl(*type), ")", expr, ")");
	}
}